

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::ParseGeneratorParameter
          (compiler *this,string_view text,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *output)

{
  size_type __n;
  pointer pbVar1;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  parts;
  string_view part;
  
  part._M_str = (char *)text._M_len;
  part._M_len = (size_t)this;
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  operator_vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_nullptr>
            (&parts,(Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     *)&part);
  for (pbVar1 = parts.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 != parts.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
    part._M_len = pbVar1->_M_len;
    part._M_str = pbVar1->_M_str;
    __n = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&part,'=',0);
    if (__n == 0xffffffffffffffff) {
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[1]>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)text._M_str,(basic_string_view<char,_std::char_traits<char>_> *)&part,
                 (char (*) [1])(anon_var_dwarf_651463 + 5));
    }
    else {
      local_70 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&part,0,__n);
      local_80 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&part,__n + 1,
                            0xffffffffffffffff);
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)text._M_str,&local_70,&local_80);
    }
  }
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&parts.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return;
}

Assistant:

void ParseGeneratorParameter(
    absl::string_view text,
    std::vector<std::pair<std::string, std::string> >* output) {
  std::vector<absl::string_view> parts =
      absl::StrSplit(text, ',', absl::SkipEmpty());

  for (absl::string_view part : parts) {
    auto equals_pos = part.find_first_of('=');
    if (equals_pos == absl::string_view::npos) {
      output->emplace_back(part, "");
    } else {
      output->emplace_back(part.substr(0, equals_pos),
                           part.substr(equals_pos + 1));
    }
  }
}